

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createSingleAllocCallbacksTest<vkt::api::(anonymous_namespace)::Device>
          (TestStatus *__return_storage_ptr__,Context *context,Context *param_3)

{
  RefData<vk::VkDevice_s_*> data;
  bool bVar1;
  deUint32 queueFamilyIndex_;
  VkAllocationCallbacks *pVVar2;
  PlatformInterface *vkp_;
  DeviceInterface *vkd_;
  VkDevice device_;
  ProgramCollection<vk::ProgramBinary> *programBinaries_;
  TestContext *pTVar3;
  TestLog *pTVar4;
  allocator<char> local_ac9;
  string local_ac8;
  allocator<char> local_aa1;
  string local_aa0;
  allocator<char> local_a79;
  string local_a78;
  uint local_a58;
  allocator<char> local_a51;
  string local_a50;
  Move<vk::VkDevice_s_*> local_a30;
  RefData<vk::VkDevice_s_*> local_a18;
  undefined1 local_a00 [8];
  Unique<vk::VkDevice_s_*> obj;
  Environment objEnv;
  AllocationCallbackRecorder objCallbacks;
  Resources res;
  undefined1 local_790 [8];
  EnvClone resEnv;
  undefined1 local_c0 [8];
  Environment rootEnv;
  AllocationCallbackRecorder resCallbacks;
  deUint32 noCmdScope;
  Context *context_local;
  TestStatus *local_10;
  
  context_local = param_3;
  local_10 = __return_storage_ptr__;
  pVVar2 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&rootEnv.maxResourceConsumers,pVVar2,0x80);
  vkp_ = Context::getPlatformInterface(context);
  vkd_ = Context::getDeviceInterface(context);
  device_ = Context::getDevice(context);
  queueFamilyIndex_ = Context::getUniversalQueueFamilyIndex(context);
  programBinaries_ = Context::getBinaryCollection(context);
  pVVar2 = ::vk::AllocationCallbacks::getCallbacks
                     ((AllocationCallbacks *)&rootEnv.maxResourceConsumers);
  Environment::Environment
            ((Environment *)local_c0,vkp_,vkd_,device_,queueFamilyIndex_,programBinaries_,pVVar2,1);
  res._432_8_ = getDefaulDeviceParameters(context);
  EnvClone::EnvClone((EnvClone *)local_790,(Environment *)local_c0,
                     (Parameters *)&res.queueFamilyIndex,1);
  Device::Resources::Resources
            ((Resources *)&objCallbacks.m_records.m_last,
             (Environment *)&resEnv.vkd.m_vk.getPastPresentationTimingGOOGLE,
             (Parameters *)&context_local);
  pVVar2 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,pVVar2,0x80);
  pVVar2 = ::vk::AllocationCallbacks::getCallbacks
                     ((AllocationCallbacks *)&objEnv.maxResourceConsumers);
  Environment::Environment
            ((Environment *)&obj.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator,
             (PlatformInterface *)resEnv.vkd.m_vk.getPastPresentationTimingGOOGLE,
             (DeviceInterface *)resEnv.env.vkp,(VkDevice)resEnv.env.vkd,(deUint32)resEnv.env.device,
             (BinaryCollection *)resEnv.env._24_8_,pVVar2,(deUint32)resEnv.env.allocationCallbacks);
  Device::create(&local_a30,
                 (Environment *)&obj.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator,
                 (Resources *)&objCallbacks.m_records.m_last,(Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a18,(Move *)&local_a30);
  data.deleter.m_destroyDevice._0_4_ = (int)local_a18.deleter.m_destroyDevice;
  data.object = local_a18.object;
  data.deleter.m_destroyDevice._4_4_ = (int)((ulong)local_a18.deleter.m_destroyDevice >> 0x20);
  data.deleter.m_allocator = local_a18.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::Unique((Unique<vk::VkDevice_s_*> *)local_a00,data);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move(&local_a30);
  pTVar3 = Context::getTestContext(context);
  pTVar4 = tcu::TestContext::getLog(pTVar3);
  bVar1 = ::vk::validateAndLog
                    (pTVar4,(AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,0x1e);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a50,"Invalid allocation callback",&local_a51);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_a50);
    std::__cxx11::string::~string((string *)&local_a50);
    std::allocator<char>::~allocator(&local_a51);
  }
  local_a58 = (uint)!bVar1;
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::~Unique((Unique<vk::VkDevice_s_*> *)local_a00);
  if (local_a58 == 0) {
    pTVar3 = Context::getTestContext(context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    bVar1 = ::vk::validateAndLog
                      (pTVar4,(AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,0);
    if (bVar1) {
      local_a58 = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a78,"Invalid allocation callback",&local_a79);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_a78);
      std::__cxx11::string::~string((string *)&local_a78);
      std::allocator<char>::~allocator(&local_a79);
      local_a58 = 1;
    }
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&objEnv.maxResourceConsumers);
  Device::Resources::~Resources((Resources *)&objCallbacks.m_records.m_last);
  EnvClone::~EnvClone((EnvClone *)local_790);
  if (local_a58 == 0) {
    pTVar3 = Context::getTestContext(context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    bVar1 = ::vk::validateAndLog
                      (pTVar4,(AllocationCallbackRecorder *)&rootEnv.maxResourceConsumers,0);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac8,"Ok",&local_ac9);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_ac8);
      std::__cxx11::string::~string((string *)&local_ac8);
      std::allocator<char>::~allocator(&local_ac9);
      local_a58 = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_aa0,"Invalid allocation callback",&local_aa1);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_aa0);
      std::__cxx11::string::~string((string *)&local_aa0);
      std::allocator<char>::~allocator(&local_aa1);
      local_a58 = 1;
    }
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&rootEnv.maxResourceConsumers);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleAllocCallbacksTest (Context& context, typename Object::Parameters params)
{
	const deUint32						noCmdScope		= (1u << VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_DEVICE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_CACHE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_OBJECT);

	// Callbacks used by resources
	AllocationCallbackRecorder			resCallbacks	(getSystemAllocator(), 128);

	// Root environment still uses default instance and device, created without callbacks
	const Environment					rootEnv			(context.getPlatformInterface(),
														 context.getDeviceInterface(),
														 context.getDevice(),
														 context.getUniversalQueueFamilyIndex(),
														 context.getBinaryCollection(),
														 resCallbacks.getCallbacks(),
														 1u);

	{
		// Test env has instance & device created with callbacks
		const EnvClone						resEnv		(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res			(resEnv.env, params);

		// Supply a separate callback recorder just for object construction
		AllocationCallbackRecorder			objCallbacks(getSystemAllocator(), 128);
		const Environment					objEnv		(resEnv.env.vkp,
														 resEnv.env.vkd,
														 resEnv.env.device,
														 resEnv.env.queueFamilyIndex,
														 resEnv.env.programBinaries,
														 objCallbacks.getCallbacks(),
														 resEnv.env.maxResourceConsumers);

		{
			Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));

			// Validate that no command-level allocations are live
			if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, noCmdScope))
				return tcu::TestStatus::fail("Invalid allocation callback");
		}

		// At this point all allocations made against object callbacks must have been freed
		if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, 0u))
			return tcu::TestStatus::fail("Invalid allocation callback");
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	return tcu::TestStatus::pass("Ok");
}